

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall
t_cpp_generator::generate_struct_declaration
          (t_cpp_generator *this,ostream *out,t_struct *tstruct,bool is_exception,bool pointers,
          bool read,bool write,bool swap,bool is_user_struct)

{
  t_field *tfield;
  bool bVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  e_req eVar6;
  ostream *poVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  t_const_value *ptVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  long lVar9;
  long lVar10;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  t_type *ptVar11;
  undefined4 extraout_var_14;
  size_type sVar12;
  reference pptVar13;
  string *psVar14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  ulong uVar15;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  char *pcVar16;
  byte local_af9;
  bool local_a1b;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_458
  ;
  t_field **local_450;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_3a8
  ;
  t_field **local_3a0;
  string local_398;
  string local_378;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_358
  ;
  t_field **local_350;
  string local_348;
  _Self local_328;
  allocator local_319;
  key_type local_318;
  _Self local_2f8;
  string local_2f0;
  t_const_value *local_2d0;
  t_const_value *cv_2;
  t_type *t_2;
  t_field **local_2b8;
  string local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250;
  string local_230;
  t_const_value *local_210;
  t_const_value *cv_1;
  string dval;
  t_type *t_1;
  t_field **local_1d8;
  allocator local_1c9;
  string local_1c8;
  string local_1a8 [8];
  string args_indent;
  undefined1 local_180 [7];
  bool init_ctor;
  string clsname_ctor;
  t_const_value *cv;
  t_type *t;
  t_field **local_148;
  byte local_13a;
  byte local_139;
  undefined1 local_138 [6];
  bool has_default_value;
  bool ok_noexcept;
  string local_118;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_f8;
  t_field **local_f0;
  allocator local_e1;
  string local_e0 [8];
  string isSet;
  undefined1 local_a8 [7];
  bool first;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_88;
  t_field **local_80;
  byte local_71;
  members_type *pmStack_70;
  bool has_nonrequired_fields;
  vector<t_field_*,_std::allocator<t_field_*>_> *members;
  const_iterator m_iter;
  allocator local_49;
  string local_48 [8];
  string extends;
  bool is_user_struct_local;
  bool swap_local;
  bool write_local;
  bool read_local;
  bool pointers_local;
  bool is_exception_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_cpp_generator *this_local;
  
  extends.field_2._M_local_buf[0xc] = write;
  extends.field_2._M_local_buf[0xb] = swap;
  extends.field_2._M_local_buf[10] = is_user_struct;
  extends.field_2._M_local_buf[0xd] = read;
  extends.field_2._M_local_buf[0xe] = pointers;
  extends.field_2._M_local_buf[0xf] = is_exception;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if ((extends.field_2._M_local_buf[0xf] & 1U) == 0) {
    if (((extends.field_2._M_local_buf[10] & 1U) != 0) && ((this->gen_templates_ & 1U) == 0)) {
      std::__cxx11::string::operator=(local_48," : public virtual ::apache::thrift::TBase");
    }
  }
  else {
    std::__cxx11::string::operator=(local_48," : public ::apache::thrift::TException");
  }
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                     *)&members);
  pmStack_70 = t_struct::get_members(tstruct);
  local_71 = 0;
  local_80 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(pmStack_70);
  members = (vector<t_field_*,_std::allocator<t_field_*>_> *)local_80;
  while( true ) {
    local_88._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(pmStack_70);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&members,&local_88);
    if (!bVar1) break;
    pptVar13 = __gnu_cxx::
               __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
               ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                            *)&members);
    eVar6 = t_field::get_req(*pptVar13);
    if (eVar6 != T_REQUIRED) {
      local_71 = 1;
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                *)&members);
  }
  if (((local_71 & 1) != 0) &&
     (((extends.field_2._M_local_buf[0xe] & 1U) == 0 ||
      ((extends.field_2._M_local_buf[0xd] & 1U) != 0)))) {
    t_generator::indent_abi_cxx11_((string *)local_a8,(t_generator *)this);
    poVar7 = std::operator<<(out,(string *)local_a8);
    poVar7 = std::operator<<(poVar7,"typedef struct _");
    iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar7 = std::operator<<(poVar7,(string *)CONCAT44(extraout_var,iVar4));
    poVar7 = std::operator<<(poVar7,"__isset {");
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)local_a8);
    t_generator::indent_up((t_generator *)this);
    poVar7 = t_generator::indent((t_generator *)this,out);
    poVar7 = std::operator<<(poVar7,"_");
    iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar7 = std::operator<<(poVar7,(string *)CONCAT44(extraout_var_00,iVar4));
    std::operator<<(poVar7,"__isset() ");
    bVar1 = true;
    members = (vector<t_field_*,_std::allocator<t_field_*>_> *)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(pmStack_70);
    while( true ) {
      isSet.field_2._8_8_ = std::vector<t_field_*,_std::allocator<t_field_*>_>::end(pmStack_70);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&members,
                         (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)((long)&isSet.field_2 + 8));
      if (!bVar2) break;
      pptVar13 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                              *)&members);
      eVar6 = t_field::get_req(*pptVar13);
      if (eVar6 != T_REQUIRED) {
        pptVar13 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                *)&members);
        ptVar8 = t_field::get_value(*pptVar13);
        pcVar16 = "false";
        if (ptVar8 != (t_const_value *)0x0) {
          pcVar16 = "true";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_e0,pcVar16,&local_e1);
        std::allocator<char>::~allocator((allocator<char> *)&local_e1);
        if (bVar1) {
          bVar1 = false;
          poVar7 = std::operator<<(out,": ");
          pptVar13 = __gnu_cxx::
                     __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                     ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                  *)&members);
          psVar14 = t_field::get_name_abi_cxx11_(*pptVar13);
          poVar7 = std::operator<<(poVar7,(string *)psVar14);
          poVar7 = std::operator<<(poVar7,"(");
          poVar7 = std::operator<<(poVar7,local_e0);
          std::operator<<(poVar7,")");
        }
        else {
          poVar7 = std::operator<<(out,", ");
          pptVar13 = __gnu_cxx::
                     __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                     ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                  *)&members);
          psVar14 = t_field::get_name_abi_cxx11_(*pptVar13);
          poVar7 = std::operator<<(poVar7,(string *)psVar14);
          poVar7 = std::operator<<(poVar7,"(");
          poVar7 = std::operator<<(poVar7,local_e0);
          std::operator<<(poVar7,")");
        }
        std::__cxx11::string::~string(local_e0);
      }
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  *)&members);
    }
    poVar7 = std::operator<<(out," {}");
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    local_f0 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(pmStack_70);
    members = (vector<t_field_*,_std::allocator<t_field_*>_> *)local_f0;
    while( true ) {
      local_f8._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(pmStack_70);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&members,&local_f8);
      if (!bVar1) break;
      pptVar13 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                              *)&members);
      eVar6 = t_field::get_req(*pptVar13);
      if (eVar6 != T_REQUIRED) {
        poVar7 = t_generator::indent((t_generator *)this,out);
        poVar7 = std::operator<<(poVar7,"bool ");
        pptVar13 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                *)&members);
        psVar14 = t_field::get_name_abi_cxx11_(*pptVar13);
        poVar7 = std::operator<<(poVar7,(string *)psVar14);
        poVar7 = std::operator<<(poVar7," :1;");
        std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
      }
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  *)&members);
    }
    t_generator::indent_down((t_generator *)this);
    poVar7 = t_generator::indent((t_generator *)this,out);
    poVar7 = std::operator<<(poVar7,"} _");
    iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar7 = std::operator<<(poVar7,(string *)CONCAT44(extraout_var_01,iVar4));
    poVar7 = std::operator<<(poVar7,"__isset;");
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  }
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x22])(this,out,tstruct);
  t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
  poVar7 = std::operator<<(out,(string *)&local_118);
  poVar7 = std::operator<<(poVar7,"class ");
  iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar7 = std::operator<<(poVar7,(string *)CONCAT44(extraout_var_02,iVar4));
  poVar7 = std::operator<<(poVar7,local_48);
  poVar7 = std::operator<<(poVar7," {");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_((string *)local_138,(t_generator *)this);
  poVar7 = std::operator<<(poVar7,(string *)local_138);
  poVar7 = std::operator<<(poVar7," public:");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)local_138);
  std::__cxx11::string::~string((string *)&local_118);
  t_generator::indent_up((t_generator *)this);
  if ((extends.field_2._M_local_buf[0xe] & 1U) == 0) {
    local_139 = is_struct_storage_not_throwing(this,tstruct);
    poVar7 = t_generator::indent((t_generator *)this,out);
    iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar7 = std::operator<<(poVar7,(string *)CONCAT44(extraout_var_03,iVar4));
    poVar7 = std::operator<<(poVar7,"(const ");
    iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar7 = std::operator<<(poVar7,(string *)CONCAT44(extraout_var_04,iVar4));
    poVar7 = std::operator<<(poVar7,"&)");
    pcVar16 = "";
    if ((local_139 & 1) != 0) {
      pcVar16 = " noexcept";
    }
    poVar7 = std::operator<<(poVar7,pcVar16);
    poVar7 = std::operator<<(poVar7,';');
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    if ((this->gen_moveable_ & 1U) != 0) {
      poVar7 = t_generator::indent((t_generator *)this,out);
      iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar7 = std::operator<<(poVar7,(string *)CONCAT44(extraout_var_05,iVar4));
      poVar7 = std::operator<<(poVar7,"(");
      iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar7 = std::operator<<(poVar7,(string *)CONCAT44(extraout_var_06,iVar4));
      poVar7 = std::operator<<(poVar7,"&&) noexcept;");
      std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    }
    poVar7 = t_generator::indent((t_generator *)this,out);
    iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar7 = std::operator<<(poVar7,(string *)CONCAT44(extraout_var_07,iVar4));
    poVar7 = std::operator<<(poVar7,"& operator=(const ");
    iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar7 = std::operator<<(poVar7,(string *)CONCAT44(extraout_var_08,iVar4));
    poVar7 = std::operator<<(poVar7,"&)");
    pcVar16 = "";
    if ((local_139 & 1) != 0) {
      pcVar16 = " noexcept";
    }
    poVar7 = std::operator<<(poVar7,pcVar16);
    poVar7 = std::operator<<(poVar7,';');
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    if ((this->gen_moveable_ & 1U) != 0) {
      poVar7 = t_generator::indent((t_generator *)this,out);
      iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar7 = std::operator<<(poVar7,(string *)CONCAT44(extraout_var_09,iVar4));
      poVar7 = std::operator<<(poVar7,"& operator=(");
      iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar7 = std::operator<<(poVar7,(string *)CONCAT44(extraout_var_10,iVar4));
      poVar7 = std::operator<<(poVar7,"&&) noexcept;");
      std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    }
    local_13a = 0;
    local_148 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(pmStack_70);
    members = (vector<t_field_*,_std::allocator<t_field_*>_> *)local_148;
    while( true ) {
      t = (t_type *)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(pmStack_70);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&members,
                         (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&t);
      if (!bVar1) break;
      pptVar13 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                              *)&members);
      ptVar11 = t_field::get_type(*pptVar13);
      ptVar11 = t_generator::get_true_type(ptVar11);
      pptVar13 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                              *)&members);
      bVar1 = is_reference(this,*pptVar13);
      if ((bVar1) || (uVar5 = (*(ptVar11->super_t_doc)._vptr_t_doc[6])(), (uVar5 & 1) != 0)) {
        pptVar13 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                *)&members);
        clsname_ctor.field_2._8_8_ = t_field::get_value(*pptVar13);
        if ((t_const_value *)clsname_ctor.field_2._8_8_ != (t_const_value *)0x0) {
          local_13a = 1;
          break;
        }
      }
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  *)&members);
    }
    iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var_11,iVar4),"()");
    poVar7 = t_generator::indent((t_generator *)this,out);
    poVar7 = std::operator<<(poVar7,(string *)local_180);
    pcVar16 = " noexcept";
    if ((local_13a & 1) != 0) {
      pcVar16 = "";
    }
    std::operator<<(poVar7,pcVar16);
    args_indent.field_2._M_local_buf[0xf] = '\0';
    t_generator::indent_abi_cxx11_(&local_1c8,(t_generator *)this);
    lVar9 = std::__cxx11::string::size();
    lVar10 = std::__cxx11::string::size();
    uVar5 = (uint)local_13a;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1a8,lVar9 + lVar10 + ((ulong)(uVar5 & 1) - 1 | 3),' ',&local_1c9);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    std::__cxx11::string::~string((string *)&local_1c8);
    local_1d8 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(pmStack_70);
    members = (vector<t_field_*,_std::allocator<t_field_*>_> *)local_1d8;
    while( true ) {
      t_1 = (t_type *)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(pmStack_70);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&members,
                         (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&t_1);
      if (!bVar1) break;
      pptVar13 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                              *)&members);
      ptVar11 = t_field::get_type(*pptVar13);
      dval.field_2._8_8_ = t_generator::get_true_type(ptVar11);
      uVar5 = (*(((t_type *)dval.field_2._8_8_)->super_t_doc)._vptr_t_doc[5])();
      if (((uVar5 & 1) == 0) &&
         (bVar3 = (**(code **)(*(long *)dval.field_2._8_8_ + 0x50))(), (bVar3 & 1) == 0)) {
        pptVar13 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                *)&members);
        bVar1 = is_reference(this,*pptVar13);
        if (bVar1) goto LAB_00201584;
      }
      else {
LAB_00201584:
        std::__cxx11::string::string((string *)&cv_1);
        pptVar13 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                *)&members);
        local_210 = t_field::get_value(*pptVar13);
        if (local_210 == (t_const_value *)0x0) {
          bVar3 = (**(code **)(*(long *)dval.field_2._8_8_ + 0x50))();
          if ((bVar3 & 1) == 0) {
            bVar3 = (**(code **)(*(long *)dval.field_2._8_8_ + 0x30))();
            local_a1b = true;
            if ((bVar3 & 1) == 0) {
              pptVar13 = __gnu_cxx::
                         __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                         ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                      *)&members);
              local_a1b = is_reference(this,*pptVar13);
            }
            pcVar16 = "0";
            if (local_a1b != false) {
              pcVar16 = "";
            }
            std::__cxx11::string::operator+=((string *)&cv_1,pcVar16);
          }
          else {
            type_name_abi_cxx11_(&local_2b0,this,(t_type *)dval.field_2._8_8_,false,false);
            std::operator+(&local_290,"static_cast<",&local_2b0);
            std::operator+(&local_270,&local_290,">(0)");
            std::__cxx11::string::operator+=((string *)&cv_1,(string *)&local_270);
            std::__cxx11::string::~string((string *)&local_270);
            std::__cxx11::string::~string((string *)&local_290);
            std::__cxx11::string::~string((string *)&local_2b0);
          }
        }
        else {
          pptVar13 = __gnu_cxx::
                     __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                     ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                  *)&members);
          psVar14 = t_field::get_name_abi_cxx11_(*pptVar13);
          std::__cxx11::string::string((string *)&local_250,(string *)psVar14);
          render_const_value(&local_230,this,out,&local_250,(t_type *)dval.field_2._8_8_,local_210);
          std::__cxx11::string::operator+=((string *)&cv_1,(string *)&local_230);
          std::__cxx11::string::~string((string *)&local_230);
          std::__cxx11::string::~string((string *)&local_250);
        }
        if ((args_indent.field_2._M_local_buf[0xf] & 1U) == 0) {
          args_indent.field_2._M_local_buf[0xf] = '\x01';
          if ((local_13a & 1) == 0) {
            poVar7 = std::operator<<(out,'\n');
            poVar7 = std::operator<<(poVar7,local_1a8);
            std::operator<<(poVar7,": ");
            std::__cxx11::string::append((char *)local_1a8);
          }
          else {
            std::operator<<(out," : ");
          }
        }
        else {
          poVar7 = std::operator<<(out,",\n");
          std::operator<<(poVar7,local_1a8);
        }
        pptVar13 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                *)&members);
        psVar14 = t_field::get_name_abi_cxx11_(*pptVar13);
        poVar7 = std::operator<<(out,(string *)psVar14);
        poVar7 = std::operator<<(poVar7,"(");
        poVar7 = std::operator<<(poVar7,(string *)&cv_1);
        std::operator<<(poVar7,")");
        std::__cxx11::string::~string((string *)&cv_1);
      }
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  *)&members);
    }
    poVar7 = std::operator<<(out," {");
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    t_generator::indent_up((t_generator *)this);
    local_2b8 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(pmStack_70);
    members = (vector<t_field_*,_std::allocator<t_field_*>_> *)local_2b8;
    while( true ) {
      t_2 = (t_type *)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(pmStack_70);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&members,
                         (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&t_2);
      if (!bVar1) break;
      pptVar13 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                              *)&members);
      ptVar11 = t_field::get_type(*pptVar13);
      cv_2 = (t_const_value *)t_generator::get_true_type(ptVar11);
      uVar5 = (*((t_doc *)&cv_2->mapVal_)->_vptr_t_doc[5])();
      if ((uVar5 & 1) == 0) {
        pptVar13 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                *)&members);
        local_2d0 = t_field::get_value(*pptVar13);
        if (local_2d0 != (t_const_value *)0x0) {
          pptVar13 = __gnu_cxx::
                     __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                     ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                  *)&members);
          psVar14 = t_field::get_name_abi_cxx11_(*pptVar13);
          std::__cxx11::string::string((string *)&local_2f0,(string *)psVar14);
          print_const_value(this,out,&local_2f0,(t_type *)cv_2,local_2d0);
          std::__cxx11::string::~string((string *)&local_2f0);
        }
      }
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  *)&members);
    }
    t_oop_generator::scope_down(&this->super_t_oop_generator,out);
    std::__cxx11::string::~string(local_1a8);
    std::__cxx11::string::~string((string *)local_180);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_318,"final",&local_319);
  local_2f8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&(tstruct->super_t_type).annotations_,&local_318);
  local_328._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&(tstruct->super_t_type).annotations_);
  bVar1 = std::operator==(&local_2f8,&local_328);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  if (bVar1) {
    poVar7 = std::operator<<(out,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_348,(t_generator *)this);
    poVar7 = std::operator<<(poVar7,(string *)&local_348);
    poVar7 = std::operator<<(poVar7,"virtual ~");
    iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar7 = std::operator<<(poVar7,(string *)CONCAT44(extraout_var_12,iVar4));
    poVar7 = std::operator<<(poVar7,"() noexcept;");
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_348);
  }
  local_350 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(pmStack_70);
  members = (vector<t_field_*,_std::allocator<t_field_*>_> *)local_350;
  while( true ) {
    local_358._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(pmStack_70);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&members,&local_358);
    if (!bVar1) break;
    pptVar13 = __gnu_cxx::
               __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
               ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                            *)&members);
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x21])(this,out,*pptVar13);
    poVar7 = t_generator::indent((t_generator *)this,out);
    pptVar13 = __gnu_cxx::
               __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
               ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                            *)&members);
    tfield = *pptVar13;
    local_af9 = 0;
    if ((extends.field_2._M_local_buf[0xe] & 1U) != 0) {
      pptVar13 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                              *)&members);
      ptVar11 = t_field::get_type(*pptVar13);
      iVar4 = (*(ptVar11->super_t_doc)._vptr_t_doc[0xc])();
      local_af9 = (byte)iVar4 ^ 0xff;
    }
    declare_field_abi_cxx11_
              (&local_378,this,tfield,false,(bool)(local_af9 & 1),
               (bool)(~extends.field_2._M_local_buf[0xd] & 1),false);
    poVar7 = std::operator<<(poVar7,(string *)&local_378);
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_378);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                *)&members);
  }
  if (((local_71 & 1) != 0) &&
     (((extends.field_2._M_local_buf[0xe] & 1U) == 0 ||
      ((extends.field_2._M_local_buf[0xd] & 1U) != 0)))) {
    poVar7 = std::operator<<(out,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_398,(t_generator *)this);
    poVar7 = std::operator<<(poVar7,(string *)&local_398);
    poVar7 = std::operator<<(poVar7,"_");
    iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar7 = std::operator<<(poVar7,(string *)CONCAT44(extraout_var_13,iVar4));
    poVar7 = std::operator<<(poVar7,"__isset __isset;");
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_398);
  }
  local_3a0 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(pmStack_70);
  members = (vector<t_field_*,_std::allocator<t_field_*>_> *)local_3a0;
  while( true ) {
    local_3a8._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(pmStack_70);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&members,&local_3a8);
    if (!bVar1) break;
    if ((extends.field_2._M_local_buf[0xe] & 1U) == 0) {
      pptVar13 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                              *)&members);
      bVar1 = is_reference(this,*pptVar13);
      if (bVar1) {
        poVar7 = std::operator<<(out,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_3c8,(t_generator *)this);
        poVar7 = std::operator<<(poVar7,(string *)&local_3c8);
        poVar7 = std::operator<<(poVar7,"void __set_");
        pptVar13 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                *)&members);
        psVar14 = t_field::get_name_abi_cxx11_(*pptVar13);
        poVar7 = std::operator<<(poVar7,(string *)psVar14);
        poVar7 = std::operator<<(poVar7,"(::std::shared_ptr<");
        pptVar13 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                *)&members);
        ptVar11 = t_field::get_type(*pptVar13);
        type_name_abi_cxx11_(&local_3e8,this,ptVar11,false,false);
        poVar7 = std::operator<<(poVar7,(string *)&local_3e8);
        std::operator<<(poVar7,">");
        std::__cxx11::string::~string((string *)&local_3e8);
        std::__cxx11::string::~string((string *)&local_3c8);
        poVar7 = std::operator<<(out," val);");
        std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
      }
      else {
        poVar7 = std::operator<<(out,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_408,(t_generator *)this);
        poVar7 = std::operator<<(poVar7,(string *)&local_408);
        poVar7 = std::operator<<(poVar7,"void __set_");
        pptVar13 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                *)&members);
        psVar14 = t_field::get_name_abi_cxx11_(*pptVar13);
        poVar7 = std::operator<<(poVar7,(string *)psVar14);
        poVar7 = std::operator<<(poVar7,"(");
        pptVar13 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                *)&members);
        ptVar11 = t_field::get_type(*pptVar13);
        type_name_abi_cxx11_(&local_428,this,ptVar11,false,true);
        std::operator<<(poVar7,(string *)&local_428);
        std::__cxx11::string::~string((string *)&local_428);
        std::__cxx11::string::~string((string *)&local_408);
        poVar7 = std::operator<<(out," val);");
        std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
      }
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                *)&members);
  }
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  if (((extends.field_2._M_local_buf[0xe] & 1U) == 0) &&
     ((this->gen_no_default_operators_ & 1U) == 0)) {
    t_generator::indent_abi_cxx11_(&local_448,(t_generator *)this);
    poVar7 = std::operator<<(out,(string *)&local_448);
    poVar7 = std::operator<<(poVar7,"bool operator == (const ");
    iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar7 = std::operator<<(poVar7,(string *)CONCAT44(extraout_var_14,iVar4));
    poVar7 = std::operator<<(poVar7," & ");
    sVar12 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size(pmStack_70);
    pcVar16 = "/* rhs */";
    if (sVar12 != 0) {
      pcVar16 = "rhs";
    }
    poVar7 = std::operator<<(poVar7,pcVar16);
    poVar7 = std::operator<<(poVar7,") const");
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_448);
    t_oop_generator::scope_up(&this->super_t_oop_generator,out);
    local_450 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(pmStack_70);
    members = (vector<t_field_*,_std::allocator<t_field_*>_> *)local_450;
    while( true ) {
      local_458._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(pmStack_70);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&members,&local_458);
      if (!bVar1) break;
      pptVar13 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                              *)&members);
      eVar6 = t_field::get_req(*pptVar13);
      if (eVar6 == T_OPTIONAL) {
        t_generator::indent_abi_cxx11_(&local_4b8,(t_generator *)this);
        poVar7 = std::operator<<(out,(string *)&local_4b8);
        poVar7 = std::operator<<(poVar7,"if (__isset.");
        pptVar13 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                *)&members);
        psVar14 = t_field::get_name_abi_cxx11_(*pptVar13);
        poVar7 = std::operator<<(poVar7,(string *)psVar14);
        poVar7 = std::operator<<(poVar7," != rhs.__isset.");
        pptVar13 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                *)&members);
        psVar14 = t_field::get_name_abi_cxx11_(*pptVar13);
        poVar7 = std::operator<<(poVar7,(string *)psVar14);
        poVar7 = std::operator<<(poVar7,")");
        poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_4d8,(t_generator *)this);
        poVar7 = std::operator<<(poVar7,(string *)&local_4d8);
        poVar7 = std::operator<<(poVar7,"  return false;");
        poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_4f8,(t_generator *)this);
        poVar7 = std::operator<<(poVar7,(string *)&local_4f8);
        poVar7 = std::operator<<(poVar7,"else if (__isset.");
        pptVar13 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                *)&members);
        psVar14 = t_field::get_name_abi_cxx11_(*pptVar13);
        poVar7 = std::operator<<(poVar7,(string *)psVar14);
        poVar7 = std::operator<<(poVar7," && !(");
        pptVar13 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                *)&members);
        psVar14 = t_field::get_name_abi_cxx11_(*pptVar13);
        poVar7 = std::operator<<(poVar7,(string *)psVar14);
        poVar7 = std::operator<<(poVar7," == rhs.");
        pptVar13 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                *)&members);
        psVar14 = t_field::get_name_abi_cxx11_(*pptVar13);
        poVar7 = std::operator<<(poVar7,(string *)psVar14);
        poVar7 = std::operator<<(poVar7,"))");
        poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_518,(t_generator *)this);
        poVar7 = std::operator<<(poVar7,(string *)&local_518);
        poVar7 = std::operator<<(poVar7,"  return false;");
        std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_518);
        std::__cxx11::string::~string((string *)&local_4f8);
        std::__cxx11::string::~string((string *)&local_4d8);
        std::__cxx11::string::~string((string *)&local_4b8);
      }
      else {
        t_generator::indent_abi_cxx11_(&local_478,(t_generator *)this);
        poVar7 = std::operator<<(out,(string *)&local_478);
        poVar7 = std::operator<<(poVar7,"if (!(");
        pptVar13 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                *)&members);
        psVar14 = t_field::get_name_abi_cxx11_(*pptVar13);
        poVar7 = std::operator<<(poVar7,(string *)psVar14);
        poVar7 = std::operator<<(poVar7," == rhs.");
        pptVar13 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                *)&members);
        psVar14 = t_field::get_name_abi_cxx11_(*pptVar13);
        poVar7 = std::operator<<(poVar7,(string *)psVar14);
        poVar7 = std::operator<<(poVar7,"))");
        poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_498,(t_generator *)this);
        poVar7 = std::operator<<(poVar7,(string *)&local_498);
        poVar7 = std::operator<<(poVar7,"  return false;");
        std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_498);
        std::__cxx11::string::~string((string *)&local_478);
      }
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  *)&members);
    }
    poVar7 = t_generator::indent((t_generator *)this,out);
    poVar7 = std::operator<<(poVar7,"return true;");
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    t_oop_generator::scope_down(&this->super_t_oop_generator,out);
    t_generator::indent_abi_cxx11_(&local_538,(t_generator *)this);
    poVar7 = std::operator<<(out,(string *)&local_538);
    poVar7 = std::operator<<(poVar7,"bool operator != (const ");
    iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar7 = std::operator<<(poVar7,(string *)CONCAT44(extraout_var_15,iVar4));
    poVar7 = std::operator<<(poVar7," &rhs) const {");
    poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_558,(t_generator *)this);
    poVar7 = std::operator<<(poVar7,(string *)&local_558);
    poVar7 = std::operator<<(poVar7,"  return !(*this == rhs);");
    poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_578,(t_generator *)this);
    poVar7 = std::operator<<(poVar7,(string *)&local_578);
    poVar7 = std::operator<<(poVar7,"}");
    poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_578);
    std::__cxx11::string::~string((string *)&local_558);
    std::__cxx11::string::~string((string *)&local_538);
    t_generator::indent_abi_cxx11_(&local_598,(t_generator *)this);
    poVar7 = std::operator<<(out,(string *)&local_598);
    poVar7 = std::operator<<(poVar7,"bool operator < (const ");
    iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar7 = std::operator<<(poVar7,(string *)CONCAT44(extraout_var_16,iVar4));
    poVar7 = std::operator<<(poVar7," & ) const;");
    poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_598);
  }
  if ((extends.field_2._M_local_buf[0xd] & 1U) != 0) {
    if ((this->gen_templates_ & 1U) == 0) {
      t_generator::indent_abi_cxx11_(&local_5f8,(t_generator *)this);
      poVar7 = std::operator<<(out,(string *)&local_5f8);
      poVar7 = std::operator<<(poVar7,"uint32_t read(");
      std::operator<<(poVar7,"::apache::thrift::protocol::TProtocol* iprot)");
      std::__cxx11::string::~string((string *)&local_5f8);
      if (((extends.field_2._M_local_buf[0xf] & 1U) == 0) &&
         (uVar15 = std::__cxx11::string::empty(), (uVar15 & 1) == 0)) {
        std::operator<<(out," override");
      }
      poVar7 = std::operator<<(out,';');
      std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    }
    else {
      t_generator::indent_abi_cxx11_(&local_5b8,(t_generator *)this);
      poVar7 = std::operator<<(out,(string *)&local_5b8);
      poVar7 = std::operator<<(poVar7,"template <class Protocol_>");
      poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_5d8,(t_generator *)this);
      poVar7 = std::operator<<(poVar7,(string *)&local_5d8);
      poVar7 = std::operator<<(poVar7,"uint32_t read(Protocol_* iprot);");
      std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_5d8);
      std::__cxx11::string::~string((string *)&local_5b8);
    }
  }
  if ((extends.field_2._M_local_buf[0xc] & 1U) != 0) {
    if ((this->gen_templates_ & 1U) == 0) {
      t_generator::indent_abi_cxx11_(&local_658,(t_generator *)this);
      poVar7 = std::operator<<(out,(string *)&local_658);
      poVar7 = std::operator<<(poVar7,"uint32_t write(");
      std::operator<<(poVar7,"::apache::thrift::protocol::TProtocol* oprot) const");
      std::__cxx11::string::~string((string *)&local_658);
      if (((extends.field_2._M_local_buf[0xf] & 1U) == 0) &&
         (uVar15 = std::__cxx11::string::empty(), (uVar15 & 1) == 0)) {
        std::operator<<(out," override");
      }
      poVar7 = std::operator<<(out,';');
      std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    }
    else {
      t_generator::indent_abi_cxx11_(&local_618,(t_generator *)this);
      poVar7 = std::operator<<(out,(string *)&local_618);
      poVar7 = std::operator<<(poVar7,"template <class Protocol_>");
      poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_638,(t_generator *)this);
      poVar7 = std::operator<<(poVar7,(string *)&local_638);
      poVar7 = std::operator<<(poVar7,"uint32_t write(Protocol_* oprot) const;");
      std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_638);
      std::__cxx11::string::~string((string *)&local_618);
    }
  }
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  if (((extends.field_2._M_local_buf[10] & 1U) != 0) &&
     (bVar1 = has_custom_ostream(this,&tstruct->super_t_type), !bVar1)) {
    t_generator::indent_abi_cxx11_(&local_678,(t_generator *)this);
    poVar7 = std::operator<<(out,(string *)&local_678);
    std::operator<<(poVar7,"virtual ");
    std::__cxx11::string::~string((string *)&local_678);
    generate_struct_print_method_decl(this,out,(t_struct *)0x0);
    poVar7 = std::operator<<(out,";");
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  }
  if ((extends.field_2._M_local_buf[0xf] & 1U) != 0) {
    t_generator::indent_abi_cxx11_(&local_698,(t_generator *)this);
    poVar7 = std::operator<<(out,(string *)&local_698);
    poVar7 = std::operator<<(poVar7,"mutable std::string thriftTExceptionMessageHolder_;");
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_698);
    t_generator::indent_abi_cxx11_(&local_6b8,(t_generator *)this);
    std::operator<<(out,(string *)&local_6b8);
    std::__cxx11::string::~string((string *)&local_6b8);
    generate_exception_what_method_decl(this,out,tstruct,false);
    poVar7 = std::operator<<(out,";");
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  }
  t_generator::indent_down((t_generator *)this);
  poVar7 = t_generator::indent((t_generator *)this,out);
  poVar7 = std::operator<<(poVar7,"};");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  if ((extends.field_2._M_local_buf[0xb] & 1U) != 0) {
    iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(extraout_var_17,iVar4),"a");
    if (!bVar1) {
      iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(extraout_var_18,iVar4),"b");
      if (!bVar1) {
        t_generator::indent_abi_cxx11_(&local_6f8,(t_generator *)this);
        poVar7 = std::operator<<(out,(string *)&local_6f8);
        poVar7 = std::operator<<(poVar7,"void swap(");
        iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
        poVar7 = std::operator<<(poVar7,(string *)CONCAT44(extraout_var_21,iVar4));
        poVar7 = std::operator<<(poVar7," &a, ");
        iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
        poVar7 = std::operator<<(poVar7,(string *)CONCAT44(extraout_var_22,iVar4));
        poVar7 = std::operator<<(poVar7," &b);");
        poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
        std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_6f8);
        goto LAB_002039cb;
      }
    }
    t_generator::indent_abi_cxx11_(&local_6d8,(t_generator *)this);
    poVar7 = std::operator<<(out,(string *)&local_6d8);
    poVar7 = std::operator<<(poVar7,"void swap(");
    iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar7 = std::operator<<(poVar7,(string *)CONCAT44(extraout_var_19,iVar4));
    poVar7 = std::operator<<(poVar7," &a1, ");
    iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar7 = std::operator<<(poVar7,(string *)CONCAT44(extraout_var_20,iVar4));
    poVar7 = std::operator<<(poVar7," &a2);");
    poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_6d8);
  }
LAB_002039cb:
  if ((extends.field_2._M_local_buf[10] & 1U) != 0) {
    generate_struct_ostream_operator_decl(this,out,tstruct);
  }
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void t_cpp_generator::generate_struct_declaration(ostream& out,
                                                  t_struct* tstruct,
                                                  bool is_exception,
                                                  bool pointers,
                                                  bool read,
                                                  bool write,
                                                  bool swap,
                                                  bool is_user_struct) {
  string extends = "";
  if (is_exception) {
    extends = " : public ::apache::thrift::TException";
  } else {
    if (is_user_struct && !gen_templates_) {
      extends = " : public virtual ::apache::thrift::TBase";
    }
  }

  // Get members
  vector<t_field*>::const_iterator m_iter;
  const vector<t_field*>& members = tstruct->get_members();

  // Write the isset structure declaration outside the class. This makes
  // the generated code amenable to processing by SWIG.
  // We only declare the struct if it gets used in the class.

  // Isset struct has boolean fields, but only for non-required fields.
  bool has_nonrequired_fields = false;
  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    if ((*m_iter)->get_req() != t_field::T_REQUIRED)
      has_nonrequired_fields = true;
  }

  if (has_nonrequired_fields && (!pointers || read)) {

    out << indent() << "typedef struct _" << tstruct->get_name() << "__isset {" << endl;
    indent_up();

    indent(out) << "_" << tstruct->get_name() << "__isset() ";
    bool first = true;
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      if ((*m_iter)->get_req() == t_field::T_REQUIRED) {
        continue;
      }
      string isSet = ((*m_iter)->get_value() != nullptr) ? "true" : "false";
      if (first) {
        first = false;
        out << ": " << (*m_iter)->get_name() << "(" << isSet << ")";
      } else {
        out << ", " << (*m_iter)->get_name() << "(" << isSet << ")";
      }
    }
    out << " {}" << endl;

    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      if ((*m_iter)->get_req() != t_field::T_REQUIRED) {
        indent(out) << "bool " << (*m_iter)->get_name() << " :1;" << endl;
      }
    }

    indent_down();
    indent(out) << "} _" << tstruct->get_name() << "__isset;" << endl;
  }

  out << endl;

  generate_java_doc(out, tstruct);

  // Open struct def
  out << indent() << "class " << tstruct->get_name() << extends << " {" << endl << indent()
      << " public:" << endl << endl;
  indent_up();

  if (!pointers) {
    bool ok_noexcept = is_struct_storage_not_throwing(tstruct);
    // Copy constructor
    indent(out) << tstruct->get_name() << "(const " << tstruct->get_name() << "&)"
                << (ok_noexcept? " noexcept" : "") << ';' << endl;

    // Move constructor
    if (gen_moveable_) {
      indent(out) << tstruct->get_name() << "(" << tstruct->get_name() << "&&) noexcept;" 
                  << endl;
    }

    // Assignment Operator
    indent(out) << tstruct->get_name() << "& operator=(const " << tstruct->get_name() << "&)"
                << (ok_noexcept? " noexcept" : "") << ';' << endl;

    // Move assignment operator
    if (gen_moveable_) {
      indent(out) << tstruct->get_name() << "& operator=(" << tstruct->get_name() << "&&) noexcept;" 
                  << endl;
    }

    bool has_default_value = false;
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      t_type* t = get_true_type((*m_iter)->get_type());
      if (is_reference(*m_iter) || t->is_string()) {
        t_const_value* cv = (*m_iter)->get_value();
        if (cv != nullptr) {
          has_default_value = true;
          break;
        }
      }
    }

    // Default constructor
    std::string clsname_ctor = tstruct->get_name() + "()";
    indent(out) << clsname_ctor << (has_default_value ? "" : " noexcept");

    bool init_ctor = false;
    std::string args_indent(
      indent().size() + clsname_ctor.size() + (has_default_value ? 3 : -1), ' ');

    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      t_type* t = get_true_type((*m_iter)->get_type());
      if (t->is_base_type() || t->is_enum() || is_reference(*m_iter)) {
        string dval;
        t_const_value* cv = (*m_iter)->get_value();
        if (cv != nullptr) {
          dval += render_const_value(out, (*m_iter)->get_name(), t, cv);
        } else if (t->is_enum()) {
          dval += "static_cast<" + type_name(t) + ">(0)";
        } else {
          dval += (t->is_string() || is_reference(*m_iter)) ? "" : "0";
        }
        if (!init_ctor) {
          init_ctor = true;
          if(has_default_value) {
            out << " : ";
          } else {
            out << '\n' << args_indent << ": ";
            args_indent.append("  ");
          }
        } else {
          out << ",\n" << args_indent;
        }
        out << (*m_iter)->get_name() << "(" << dval << ")";
      }
    }
    out << " {" << endl;
    indent_up();
    // TODO(dreiss): When everything else in Thrift is perfect,
    // do more of these in the initializer list.
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      t_type* t = get_true_type((*m_iter)->get_type());

      if (!t->is_base_type()) {
        t_const_value* cv = (*m_iter)->get_value();
        if (cv != nullptr) {
          print_const_value(out, (*m_iter)->get_name(), t, cv);
        }
      }
    }
    scope_down(out);
  }

  if (tstruct->annotations_.find("final") == tstruct->annotations_.end()) {
    out << endl << indent() << "virtual ~" << tstruct->get_name() << "() noexcept;" << endl;
  }

  // Declare all fields
  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
	generate_java_doc(out, *m_iter);
    indent(out) << declare_field(*m_iter,
                                 false,
                                 (pointers && !(*m_iter)->get_type()->is_xception()),
                                 !read) << endl;
  }

  // Add the __isset data member if we need it, using the definition from above
  if (has_nonrequired_fields && (!pointers || read)) {
    out << endl << indent() << "_" << tstruct->get_name() << "__isset __isset;" << endl;
  }

  // Create a setter function for each field
  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    if (pointers) {
      continue;
    }
    if (is_reference((*m_iter))) {
      out << endl << indent() << "void __set_" << (*m_iter)->get_name() << "(::std::shared_ptr<"
          << type_name((*m_iter)->get_type(), false, false) << ">";
      out << " val);" << endl;
    } else {
      out << endl << indent() << "void __set_" << (*m_iter)->get_name() << "("
          << type_name((*m_iter)->get_type(), false, true);
      out << " val);" << endl;
    }
  }
  out << endl;

  if (!pointers) {
    // Should we generate default operators?
    if (!gen_no_default_operators_) {
      // Generate an equality testing operator.  Make it inline since the compiler
      // will do a better job than we would when deciding whether to inline it.
      out << indent() << "bool operator == (const " << tstruct->get_name() << " & "
          << (members.size() > 0 ? "rhs" : "/* rhs */") << ") const" << endl;
      scope_up(out);
      for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
        // Most existing Thrift code does not use isset or optional/required,
        // so we treat "default" fields as required.
        if ((*m_iter)->get_req() != t_field::T_OPTIONAL) {
          out << indent() << "if (!(" << (*m_iter)->get_name() << " == rhs."
              << (*m_iter)->get_name() << "))" << endl << indent() << "  return false;" << endl;
        } else {
          out << indent() << "if (__isset." << (*m_iter)->get_name() << " != rhs.__isset."
              << (*m_iter)->get_name() << ")" << endl << indent() << "  return false;" << endl
              << indent() << "else if (__isset." << (*m_iter)->get_name() << " && !("
              << (*m_iter)->get_name() << " == rhs." << (*m_iter)->get_name() << "))" << endl
              << indent() << "  return false;" << endl;
        }
      }
      indent(out) << "return true;" << endl;
      scope_down(out);
      out << indent() << "bool operator != (const " << tstruct->get_name() << " &rhs) const {"
          << endl << indent() << "  return !(*this == rhs);" << endl << indent() << "}" << endl
          << endl;

      // Generate the declaration of a less-than operator.  This must be
      // implemented by the application developer if they wish to use it.  (They
      // will get a link error if they try to use it without an implementation.)
      out << indent() << "bool operator < (const " << tstruct->get_name() << " & ) const;" << endl
          << endl;
    }
  }

  if (read) {
    if (gen_templates_) {
      out << indent() << "template <class Protocol_>" << endl << indent()
          << "uint32_t read(Protocol_* iprot);" << endl;
    } else {
      out << indent() << "uint32_t read("
          << "::apache::thrift::protocol::TProtocol* iprot)";
      if(!is_exception && !extends.empty())
        out << " override";
      out << ';' << endl;
    }
  }
  if (write) {
    if (gen_templates_) {
      out << indent() << "template <class Protocol_>" << endl << indent()
          << "uint32_t write(Protocol_* oprot) const;" << endl;
    } else {
      out << indent() << "uint32_t write("
          << "::apache::thrift::protocol::TProtocol* oprot) const";
      if(!is_exception && !extends.empty())
        out << " override";
      out << ';' << endl;
    }
  }
  out << endl;

  if (is_user_struct && !has_custom_ostream(tstruct)) {
    out << indent() << "virtual ";
    generate_struct_print_method_decl(out, nullptr);
    out << ";" << endl;
  }

  // std::exception::what()
  if (is_exception) {
    out << indent() << "mutable std::string thriftTExceptionMessageHolder_;" << endl;
    out << indent();
    generate_exception_what_method_decl(out, tstruct, false);
    out << ";" << endl;
  }

  indent_down();
  indent(out) << "};" << endl << endl;

  if (swap) {
    // Generate a namespace-scope swap() function
    if (tstruct->get_name() == "a" || tstruct->get_name() == "b") {
      out << indent() << "void swap(" << tstruct->get_name() << " &a1, " << tstruct->get_name()
          << " &a2);" << endl << endl;
    } else {
       out << indent() << "void swap(" << tstruct->get_name() << " &a, " << tstruct->get_name()
           << " &b);" << endl << endl;
    }
  }

  if (is_user_struct) {
    generate_struct_ostream_operator_decl(out, tstruct);
  }
}